

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitRefCast(OptimizeInstructions *this,RefCast *curr)

{
  Type *this_00;
  Type *this_01;
  uintptr_t uVar1;
  Builder BVar2;
  bool bVar3;
  EvaluationResult EVar4;
  Index index;
  Id IVar5;
  Expression **ppEVar6;
  Drop *left;
  LocalGet *right;
  LocalSet *pLVar7;
  Block *value;
  pointer puVar8;
  HeapType HVar9;
  Expression **ref;
  Drop *local_68;
  Unreachable *local_60;
  HeapType local_58;
  Type newType;
  Builder local_40;
  Builder builder;
  
  if ((curr->ref->type).id == 1) {
    return;
  }
  ref = &curr->ref;
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type;
  bVar3 = wasm::Type::isNonNullable(this_00);
  if ((bVar3) && (bVar3 = trapOnNull(this,(Expression *)curr,ref), bVar3)) {
    return;
  }
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  local_58 = wasm::Type::getHeapType(this_00);
  HVar9.id._0_4_ = HeapType::getBottom(&stack0xffffffffffffffa8);
  HVar9.id._4_4_ = 0;
  builder.wasm = (Module *)ref;
  do {
    value = (Block *)*ref;
    EVar4 = GCTypeUtils::evaluateCastCheck
                      ((Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type.id,(Type)this_00->id);
    if (EVar4 == SuccessOnlyIfNull) {
      bVar3 = wasm::Type::isNullable(this_00);
      BVar2 = builder;
      if ((!bVar3) ||
         (bVar3 = wasm::Type::isNullable
                            ((Type *)(((builder.wasm)->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1)), !bVar3)) {
        __assert_fail("curr->type.isNullable() && curr->ref->type.isNullable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x7fc,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
      }
      if ((((this->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).super_Pass.runner)->options).trapsNeverHappen == true) {
        local_68 = Builder::makeDrop(&local_40,
                                     (Expression *)
                                     ((BVar2.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        local_60 = (Unreachable *)Builder::makeRefNull(&local_40,HVar9);
        goto LAB_008edbba;
      }
      wasm::Type::Type((Type *)&stack0xffffffffffffffa8,HVar9,Nullable);
      if ((Drop **)this_00->id != (Drop **)local_58.id) {
        (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
             local_58.id;
        value = (Block *)curr;
        goto LAB_008edc73;
      }
    }
    else {
      if (EVar4 == Failure) {
        local_68 = Builder::makeDrop(&local_40,
                                     (Expression *)
                                     ((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        local_60 = MixedArena::alloc<wasm::Unreachable>(&(local_40.wasm)->allocator);
LAB_008edbba:
        local_58.id = (uintptr_t)&local_68;
        newType.id = 2;
        value = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          (&local_40,
                           (initializer_list<wasm::Expression_*> *)&stack0xffffffffffffffa8,
                           (Type)this_00->id);
        goto LAB_008edc73;
      }
      if (EVar4 == Success) {
        bVar3 = wasm::Type::isSubType
                          ((Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>).
                                 super_Expression.type.id,(Type)this_00->id);
        if (!bVar3) {
          __assert_fail("Type::isSubType(ref->type, curr->type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x7d5,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
        }
        this_01 = &(value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type;
        if (this_00->id != this_01->id) {
          this->refinalize = true;
        }
        if (value != (Block *)((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) {
          bVar3 = wasm::Type::isNull(this_01);
          if (bVar3) {
            left = Builder::makeDrop(&local_40,
                                     (Expression *)
                                     ((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            right = (LocalGet *)Builder::makeRefNull(&local_40,HVar9);
          }
          else {
            index = Builder::addVar((this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .currFunction,
                                    (Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>)
                                          .super_Expression.type.id);
            pLVar7 = Builder::makeLocalTee
                               (&local_40,index,(Expression *)value,
                                (Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>).
                                      super_Expression.type.id);
            *ref = (Expression *)pLVar7;
            left = Builder::makeDrop(&local_40,
                                     (Expression *)
                                     ((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            uVar1 = (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                    .id;
            right = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
            right->index = index;
            (right->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
                 uVar1;
          }
          value = Builder::makeSequence(&local_40,(Expression *)left,(Expression *)right);
        }
        goto LAB_008edc73;
      }
    }
    ppEVar6 = Properties::getImmediateFallthroughPtr
                        (ref,&((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule,AllowTeeBrIf);
    BVar2 = builder;
    bVar3 = ppEVar6 != ref;
    ref = ppEVar6;
  } while (bVar3);
  EVar4 = GCTypeUtils::evaluateCastCheck
                    ((Type)*(uintptr_t *)
                            &((builder.wasm)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                     ,(Type)this_00->id);
  value = (Block *)((BVar2.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  if (EVar4 == SuccessOnlyIfNonNull) {
    value = (Block *)Builder::makeRefAs(&local_40,RefAsNonNull,(Expression *)value);
LAB_008edc73:
    replaceCurrent(this,(Expression *)value);
    return;
  }
  if (EVar4 == Success) goto LAB_008edc73;
  IVar5 = (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id;
  if (IVar5 == RefCastId) {
    EVar4 = GCTypeUtils::evaluateCastCheck
                      ((Type)this_00->id,
                       (Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type.id);
    if (EVar4 == Success) {
      ((BVar2.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(value->name).super_IString.str._M_len;
      return;
    }
    if (EVar4 == SuccessOnlyIfNonNull) {
      puVar8 = (pointer)(value->name).super_IString.str._M_len;
      goto LAB_008edca8;
    }
    value = (Block *)((BVar2.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    IVar5 = (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id;
  }
  if (IVar5 != RefAsId) {
    return;
  }
  if ((int)(value->name).super_IString.str._M_len != 0) {
    return;
  }
  puVar8 = (pointer)(value->name).super_IString.str._M_str;
LAB_008edca8:
  ((BVar2.wasm)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar8;
  HVar9 = wasm::Type::getHeapType(this_00);
  wasm::Type::Type((Type *)&stack0xffffffffffffffa8,HVar9,NonNullable);
  this_00->id = local_58.id;
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    // Note we must check the ref's type here and not our own, since we only
    // refinalize at the end, which means our type may not have been updated yet
    // after a change in the child.
    // TODO: we could update unreachability up the stack perhaps, or just move
    //       all patterns that can add unreachability to a pass that does so
    //       already like vacuum or dce.
    if (curr->ref->type == Type::unreachable) {
      return;
    }

    if (curr->type.isNonNullable() && trapOnNull(curr, curr->ref)) {
      return;
    }

    // Check whether the cast will definitely fail (or succeed). Look not just
    // at the fallthrough but all intermediatary fallthrough values as well, as
    // if any of them has a type that cannot be cast to us, then we will trap,
    // e.g.
    //
    //   (ref.cast $struct-A
    //     (ref.cast $struct-B
    //       (ref.cast $array
    //         (local.get $x)
    //
    // The fallthrough is the local.get, but the array cast in the middle
    // proves a trap must happen.
    Builder builder(*getModule());
    auto nullType = curr->type.getHeapType().getBottom();
    {
      auto** refp = &curr->ref;
      while (1) {
        auto* ref = *refp;

        auto result = GCTypeUtils::evaluateCastCheck(ref->type, curr->type);

        if (result == GCTypeUtils::Success) {
          // The cast will succeed. This can only happen if the ref is a subtype
          // of the cast instruction, which means we can replace the cast with
          // the ref.
          assert(Type::isSubType(ref->type, curr->type));
          if (curr->type != ref->type) {
            refinalize = true;
          }
          // If there were no intermediate expressions, we can just skip the
          // cast.
          if (ref == curr->ref) {
            replaceCurrent(ref);
            return;
          }
          // Otherwise we can't just remove the cast and replace it with `ref`
          // because the intermediate expressions might have had side effects.
          // We can replace the cast with a drop followed by a direct return of
          // the value, though.
          if (ref->type.isNull()) {
            // We can materialize the resulting null value directly.
            replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                                builder.makeRefNull(nullType)));
            return;
          }
          // We need to use a tee to return the value since we can't materialize
          // it directly.
          auto scratch = builder.addVar(getFunction(), ref->type);
          *refp = builder.makeLocalTee(scratch, ref, ref->type);
          replaceCurrent(
            builder.makeSequence(builder.makeDrop(curr->ref),
                                 builder.makeLocalGet(scratch, ref->type)));
          return;
        } else if (result == GCTypeUtils::Failure) {
          // This cast cannot succeed, so it will trap.
          // Make sure to emit a block with the same type as us; leave updating
          // types for other passes.
          replaceCurrent(builder.makeBlock(
            {builder.makeDrop(curr->ref), builder.makeUnreachable()},
            curr->type));
          return;
        } else if (result == GCTypeUtils::SuccessOnlyIfNull) {
          // If either cast or ref types were non-nullable then the cast could
          // never succeed, and we'd have reached |Failure|, above.
          assert(curr->type.isNullable() && curr->ref->type.isNullable());

          // The cast either returns null, or traps. In trapsNeverHappen mode
          // we know the result, since it by assumption will not trap.
          if (getPassOptions().trapsNeverHappen) {
            replaceCurrent(builder.makeBlock(
              {builder.makeDrop(curr->ref), builder.makeRefNull(nullType)},
              curr->type));
            return;
          }

          // Without trapsNeverHappen we can at least sharpen the type here, if
          // it is not already a null type.
          auto newType = Type(nullType, Nullable);
          if (curr->type != newType) {
            curr->type = newType;
            // Call replaceCurrent() to make us re-optimize this node, as we
            // may have just unlocked further opportunities. (We could just
            // continue down to the rest, but we'd need to do more work to
            // make sure all the local state in this function is in sync
            // which this change; it's easier to just do another clean pass
            // on this node.)
            replaceCurrent(curr);
            return;
          }
        }

        auto** last = refp;
        refp = Properties::getImmediateFallthroughPtr(
          refp, getPassOptions(), *getModule());
        if (refp == last) {
          break;
        }
      }
    }

    // See what we know about the cast result.
    //
    // Note that we could look at the fallthrough for the ref, but that would
    // require additional work to make sure we emit something that validates
    // properly. TODO
    auto result = GCTypeUtils::evaluateCastCheck(curr->ref->type, curr->type);

    if (result == GCTypeUtils::Success) {
      replaceCurrent(curr->ref);
      return;
    } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
      // All we need to do is check for a null here.
      //
      // As above, we must refinalize as we may now be emitting a more refined
      // type (specifically a more refined heap type).
      replaceCurrent(builder.makeRefAs(RefAsNonNull, curr->ref));
      return;
    }

    if (auto* child = curr->ref->dynCast<RefCast>()) {
      // Repeated casts can be removed, leaving just the most demanding of
      // them. Note that earlier we already checked for the cast of the ref's
      // type being more refined, so all we need to handle is the opposite, that
      // is, something like this:
      //
      //   (ref.cast $B
      //     (ref.cast $A
      //
      // where $B is a subtype of $A. We don't need to cast to $A here; we can
      // just cast all the way to $B immediately. To check this, see if the
      // parent's type would succeed if cast by the child's; if it must then the
      // child's is redundant.
      auto result = GCTypeUtils::evaluateCastCheck(curr->type, child->type);
      if (result == GCTypeUtils::Success) {
        curr->ref = child->ref;
        return;
      } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
        // Similar to above, but we must also trap on null.
        curr->ref = child->ref;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
        return;
      }
    }

    // ref.cast can be combined with ref.as_non_null,
    //
    //   (ref.cast null (ref.as_non_null ..))
    // =>
    //   (ref.cast ..)
    //
    if (auto* as = curr->ref->dynCast<RefAs>()) {
      if (as->op == RefAsNonNull) {
        curr->ref = as->value;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
      }
    }
  }